

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_insertproxymodel.cpp
# Opt level: O3

void InsertProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Int *pIVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  undefined1 uVar6;
  InsertDirections IVar7;
  undefined8 *puVar8;
  int iVar9;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  void *local_28;
  undefined1 *local_20;
  void *pvStack_18;
  undefined1 *local_10;
  
  local_20 = (undefined1 *)&local_48;
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = (undefined1 *)_a[1];
      iVar9 = 0;
      break;
    case 1:
      local_10 = (undefined1 *)_a[3];
      local_20 = (undefined1 *)_a[1];
      pvStack_18 = _a[2];
      iVar9 = 1;
      break;
    case 2:
      local_48 = (QArrayData *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      local_28 = (void *)0x0;
      local_20 = (undefined1 *)_a[1];
      pvStack_18 = _a[2];
      local_10 = (undefined1 *)&local_48;
      QMetaObject::activate(_o,&staticMetaObject,1,&local_28);
      if (local_48 == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
        return;
      }
      QArrayData::deallocate(local_48,4,8);
      return;
    case 3:
      local_48 = (QArrayData *)CONCAT71(local_48._1_7_,*_a[1]);
      iVar9 = 3;
      break;
    case 4:
      local_48 = (QArrayData *)CONCAT44(local_48._4_4_,*_a[1]);
      iVar9 = 4;
      local_20 = (undefined1 *)&local_48;
      break;
    case 5:
      uVar6 = (**(code **)(*(long *)_o + 0x1d8))();
      goto LAB_0011c9f5;
    case 6:
      uVar6 = (**(code **)(*(long *)_o + 0x1e0))();
LAB_0011c9f5:
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(undefined1 *)*_a = uVar6;
      }
    default:
      goto switchD_0011c7ab_caseD_3;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,&local_28);
    break;
  case ReadProperty:
    pIVar1 = (Int *)*_a;
    if (_id == 1) {
      bVar5 = mergeDisplayEdit((InsertProxyModel *)_o);
      *(bool *)pIVar1 = bVar5;
    }
    else if (_id == 0) {
      IVar7 = insertDirection((InsertProxyModel *)_o);
      *pIVar1 = IVar7.i;
    }
    break;
  case WriteProperty:
    if (_id == 1) {
      setMergeDisplayEdit((InsertProxyModel *)_o,**_a);
      return;
    }
    if (_id == 0) {
      local_28 = (void *)CONCAT44(local_28._4_4_,**_a);
      setInsertDirection((InsertProxyModel *)_o,(InsertDirections *)&local_28);
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == dataForCornerChanged && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == extraDataChanged && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == mergeDisplayEditChanged && lVar4 == 0) {
      *puVar2 = 3;
    }
    else if (pcVar3 == insertDirectionChanged && lVar4 == 0) {
      *puVar2 = 4;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar8 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
LAB_0011c8ab:
        *puVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        return;
      }
    }
    else if (_id == 1) {
      puVar8 = (undefined8 *)*_a;
      if (*_a[1] == 2) goto LAB_0011c8ab;
    }
    else {
      puVar8 = (undefined8 *)*_a;
    }
    *puVar8 = 0;
  }
switchD_0011c7ab_caseD_3:
  return;
}

Assistant:

void InsertProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dataForCornerChanged((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1]))); break;
        case 1: _t->extraDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 2: _t->extraDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->mergeDisplayEditChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->insertDirectionChanged((*reinterpret_cast< std::add_pointer_t<InsertDirections>>(_a[1]))); break;
        case 5: { bool _r = _t->commitRow();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 6: { bool _r = _t->commitColumn();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (InsertProxyModel::*)(const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::dataForCornerChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(const QModelIndex & , const QModelIndex & , const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::extraDataChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::mergeDisplayEditChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(InsertDirections );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::insertDirectionChanged)) {
                *result = 4;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = QFlag(_t->insertDirection()); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->mergeDisplayEdit(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInsertDirection(QFlag(*reinterpret_cast<int*>(_v))); break;
        case 1: _t->setMergeDisplayEdit(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}